

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecPrimary(Parser *this)

{
  TokenType TVar1;
  uint uVar2;
  pointer pcVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  CompileContext *pCVar7;
  uint *puVar8;
  long lVar9;
  size_type *psVar10;
  ParseError *__return_storage_ptr__;
  undefined8 uVar11;
  void *pvVar12;
  Parser *in_RSI;
  size_type __dnew;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b0;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  char local_80 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_78;
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  local_68;
  double local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  __node_base_ptr local_38;
  
  TVar1 = (in_RSI->m_current).type;
  switch(TVar1) {
  case IDENTIFIER:
    advance(in_RSI);
    pCVar7 = (CompileContext *)operator_new(0x38);
    local_d0._0_4_ = (in_RSI->m_previous).type;
    pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_c8._M_p = local_c0 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
    (pCVar7->m_source)._M_dataplus._M_p = (pointer)&PTR__SymbolExpr_001277b0;
    *(undefined4 *)&(pCVar7->m_source)._M_string_length = local_d0._0_4_;
    (pCVar7->m_source).field_2._M_allocated_capacity = (size_type)&pCVar7->m_options;
    if (local_c8._M_p == local_c0 + 8) {
      (pCVar7->m_options).m_filename._M_dataplus._M_p = (pointer)local_c0._8_8_;
      (pCVar7->m_options).m_filename._M_string_length = aStack_b0._0_8_;
    }
    else {
      (pCVar7->m_source).field_2._M_allocated_capacity = (size_type)local_c8._M_p;
      (pCVar7->m_options).m_filename._M_dataplus._M_p = (pointer)local_c0._8_8_;
    }
    *(undefined8 *)((long)&(pCVar7->m_source).field_2 + 8) = local_c0._0_8_;
    *(line_t *)&(pCVar7->m_options).m_filename.field_2 = (in_RSI->m_previous).line;
    *(col_t *)((long)&(pCVar7->m_options).m_filename.field_2 + 4) = (in_RSI->m_previous).col;
    goto LAB_0010fada;
  case INTEGER:
    advance(in_RSI);
    pCVar7 = (CompileContext *)(in_RSI->m_previous).lexeme._M_dataplus._M_p;
    puVar8 = (uint *)__errno_location();
    uVar2 = *puVar8;
    pvVar12 = (void *)(ulong)uVar2;
    *puVar8 = 0;
    lVar9 = strtol((char *)pCVar7,(char **)local_d0,10);
    if (local_d0 != (undefined1  [8])pCVar7) {
      if (((int)lVar9 == lVar9) && (*puVar8 != 0x22)) {
        if (*puVar8 == 0) {
          *puVar8 = uVar2;
        }
        pCVar7 = (CompileContext *)operator_new(0x10);
        (pCVar7->m_source)._M_dataplus._M_p = (pointer)&PTR__Expr_001276d8;
        *(int *)&(pCVar7->m_source)._M_string_length = (int)lVar9;
        goto LAB_0010fa99;
      }
      goto LAB_0010fdf0;
    }
    std::__throw_invalid_argument("stoi");
    break;
  case FLOAT:
    advance(in_RSI);
    pCVar7 = (CompileContext *)(in_RSI->m_previous).lexeme._M_dataplus._M_p;
    in_RSI = (Parser *)__errno_location();
    uVar2 = *(uint *)&in_RSI->m_context;
    pvVar12 = (void *)(ulong)uVar2;
    *(int *)&in_RSI->m_context = 0;
    local_50 = strtod((char *)pCVar7,(char **)local_d0);
    if (local_d0 != (undefined1  [8])pCVar7) {
      if (*(int *)&in_RSI->m_context == 0) {
        *(uint *)&in_RSI->m_context = uVar2;
      }
      else if (*(int *)&in_RSI->m_context == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_0010f9af;
      }
      pCVar7 = (CompileContext *)operator_new(0x10);
      (pCVar7->m_source)._M_dataplus._M_p = (pointer)&PTR__Expr_00127720;
      (pCVar7->m_source)._M_string_length = (size_type)local_50;
      goto LAB_0010fa99;
    }
    break;
  case STRING:
    advance(in_RSI);
    pCVar7 = (CompileContext *)operator_new(0x28);
    pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_d0 = (undefined1  [8])local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
    (pCVar7->m_source)._M_dataplus._M_p = (pointer)&PTR__StringExpr_00127768;
    psVar10 = (size_type *)((long)&(pCVar7->m_source).field_2 + 8);
    (pCVar7->m_source)._M_string_length = (size_type)psVar10;
    if (local_d0 == (undefined1  [8])local_c0) {
      *psVar10 = local_c0._0_8_;
      (pCVar7->m_options).m_filename._M_dataplus._M_p = (pointer)local_c0._8_8_;
    }
    else {
      (pCVar7->m_source)._M_string_length = (size_type)local_d0;
      *(undefined8 *)((long)&(pCVar7->m_source).field_2 + 8) = local_c0._0_8_;
    }
    (pCVar7->m_source).field_2._M_allocated_capacity = (size_type)local_c8._M_p;
LAB_0010fada:
    this->m_context = pCVar7;
    return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
           (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
  case INTERPOLATION:
    advance(in_RSI);
    parseInterpolationExpr(this);
    return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
           (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
  case AND:
  case AS:
  case ASSOC:
  case BREAK:
  case CASE:
  case CONTINUE:
  case DEFAULT:
  case ELSE:
  case ENUM:
switchD_0010f76b_caseD_27:
    __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
    local_d0 = (undefined1  [8])local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Expected expression.","");
    errorAtCurrent(__return_storage_ptr__,in_RSI,(string *)local_d0);
    __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error);
  case FALSE:
    advance(in_RSI);
    pCVar7 = (CompileContext *)operator_new(0x10);
    (pCVar7->m_source)._M_dataplus._M_p = (pointer)&PTR__Expr_001273c0;
    *(undefined1 *)&(pCVar7->m_source)._M_string_length = 0;
    goto LAB_0010fa99;
  default:
    if (TVar1 == LEFT_PAREN) {
LAB_0010f9af:
      advance(in_RSI);
      local_a0._8_4_ = (in_RSI->m_previous).type;
      pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      local_90._0_8_ = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
      aStack_78._12_2_ = (in_RSI->m_previous).col;
      aStack_78._8_4_ = (in_RSI->m_previous).line;
      if ((in_RSI->m_current).type == RIGHT_PAREN) {
        advance(in_RSI);
        pCVar7 = (CompileContext *)operator_new(0x38);
        if ((char *)local_90._0_8_ == local_80) {
          aStack_b0._0_8_ = aStack_78._M_allocated_capacity;
          local_90._0_8_ = local_c0 + 8;
        }
        local_c0[9] = local_80[1];
        local_c0[10] = local_80[2];
        local_c0[0xb] = local_80[3];
        local_c0[0xc] = local_80[4];
        local_c0[0xd] = local_80[5];
        local_c0[0xe] = local_80[6];
        local_c0[0xf] = local_80[7];
        local_c0[8] = local_80[0];
        (pCVar7->m_source)._M_dataplus._M_p = (pointer)&PTR__UnitExpr_00126f10;
        *(undefined4 *)&(pCVar7->m_source)._M_string_length = local_a0._8_4_;
        (pCVar7->m_source).field_2._M_allocated_capacity = (size_type)&pCVar7->m_options;
        if ((undefined1 *)local_90._0_8_ == local_c0 + 8) {
          (pCVar7->m_options).m_filename._M_dataplus._M_p = (pointer)local_c0._8_8_;
          (pCVar7->m_options).m_filename._M_string_length = aStack_b0._0_8_;
        }
        else {
          (pCVar7->m_source).field_2._M_allocated_capacity = local_90._0_8_;
          (pCVar7->m_options).m_filename._M_dataplus._M_p = (pointer)local_c0._8_8_;
        }
        *(undefined8 *)((long)&(pCVar7->m_source).field_2 + 8) = local_90._8_8_;
        *(undefined4 *)&(pCVar7->m_options).m_filename.field_2 = aStack_78._8_4_;
        *(undefined2 *)((long)&(pCVar7->m_options).m_filename.field_2 + 4) = aStack_78._12_2_;
        this->m_context = pCVar7;
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      parseExpr((Parser *)local_a0);
      if ((in_RSI->m_current).type == RIGHT_PAREN) {
        advance(in_RSI);
        this->m_context = (CompileContext *)local_a0._0_8_;
      }
      else {
        local_68.
        super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
        ::emplace_back<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                  ((vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                    *)&local_68,
                   (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_a0);
        if ((in_RSI->m_current).type == COMMA) {
          do {
            advance(in_RSI);
            parseExpr((Parser *)local_d0);
            std::
            vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
            ::emplace_back<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                      ((vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                        *)&local_68,
                       (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_d0);
            if (local_d0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_d0 + 8))();
            }
          } while ((in_RSI->m_current).type == COMMA);
        }
        local_48._M_allocated_capacity = 0x22;
        local_d0 = (undefined1  [8])local_c0;
        local_d0 = (undefined1  [8])
                   std::__cxx11::string::_M_create((ulong *)local_d0,(ulong)&local_48);
        local_c0._0_8_ = local_48._M_allocated_capacity;
        (((CompileContext *)local_d0)->m_source).field_2._M_allocated_capacity = 0x656c707574207265;
        builtin_strncpy((char *)((long)&(((CompileContext *)local_d0)->m_source).field_2 + 8),
                        " element",8);
        (((CompileContext *)local_d0)->m_source)._M_dataplus._M_p = (pointer)0x6465746365707845;
        (((CompileContext *)local_d0)->m_source)._M_string_length = 0x7466612027292720;
        *(undefined2 *)&(((CompileContext *)local_d0)->m_options).m_filename._M_dataplus._M_p =
             0x2e73;
        local_c8._M_p = (pointer)local_48._M_allocated_capacity;
        *(char *)((long)&(((CompileContext *)local_d0)->m_source)._M_dataplus._M_p +
                 local_48._M_allocated_capacity) = '\0';
        expect(in_RSI,RIGHT_PAREN,(string *)local_d0);
        if (local_d0 != (undefined1  [8])local_c0) {
          operator_delete((void *)local_d0,(ulong)(local_c0._0_8_ + 1));
        }
        pCVar7 = (CompileContext *)operator_new(0x50);
        puVar6 = local_68.
                 super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar5 = local_68.
                 super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar4 = local_68.
                 super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = local_90._8_8_;
        local_68.
        super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8._M_p = local_c0 + 8;
        local_d0._0_4_ = local_a0._8_4_;
        if ((char *)local_90._0_8_ == local_80) {
          aStack_b0._0_8_ = aStack_78._M_allocated_capacity;
          local_90._0_8_ = local_c8._M_p;
        }
        local_c0[9] = local_80[1];
        local_c0[10] = local_80[2];
        local_c0[0xb] = local_80[3];
        local_c0[0xc] = local_80[4];
        local_c0[0xd] = local_80[5];
        local_c0[0xe] = local_80[6];
        local_c0[0xf] = local_80[7];
        local_c0[8] = local_80[0];
        local_90._8_8_ = 0;
        local_80[0] = '\0';
        aStack_b0._8_4_ = aStack_78._8_4_;
        aStack_b0._12_2_ = aStack_78._12_2_;
        (pCVar7->m_source)._M_dataplus._M_p = (pointer)&PTR__TupleExpr_001277f8;
        (pCVar7->m_source)._M_string_length = (size_type)puVar4;
        (pCVar7->m_source).field_2._M_allocated_capacity = (size_type)puVar5;
        *(pointer *)((long)&(pCVar7->m_source).field_2 + 8) = puVar6;
        local_38 = (__node_base_ptr)0x0;
        local_48._M_allocated_capacity = 0;
        local_48._8_8_ = 0;
        *(undefined4 *)&(pCVar7->m_options).m_filename._M_dataplus._M_p = local_a0._8_4_;
        psVar10 = (size_type *)((long)&(pCVar7->m_options).m_filename.field_2 + 8);
        (pCVar7->m_options).m_filename._M_string_length = (size_type)psVar10;
        if ((pointer)local_90._0_8_ == local_c8._M_p) {
          *psVar10 = local_c0._8_8_;
          (pCVar7->m_options).m_programArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)aStack_b0._0_8_;
        }
        else {
          (pCVar7->m_options).m_filename._M_string_length = local_90._0_8_;
          *(undefined8 *)((long)&(pCVar7->m_options).m_filename.field_2 + 8) = local_c0._8_8_;
        }
        (pCVar7->m_options).m_filename.field_2._M_allocated_capacity = uVar11;
        local_c0._0_8_ = (pointer)0x0;
        local_c0._8_8_ = (ulong)(uint7)local_80._1_7_ << 8;
        *(undefined2 *)
         ((long)&(pCVar7->m_options).m_programArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = aStack_78._12_2_;
        *(undefined4 *)
         &(pCVar7->m_options).m_programArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = aStack_78._8_4_;
        local_90._0_8_ = local_80;
        std::
        vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
        ::~vector((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                   *)&local_48);
        this->m_context = pCVar7;
        std::
        vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
        ::~vector(&local_68);
        if ((CompileContext *)local_a0._0_8_ != (CompileContext *)0x0) {
          (**(code **)((((string *)local_a0._0_8_)->_M_dataplus)._M_p + 8))();
        }
      }
      if ((char *)local_90._0_8_ == local_80) {
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      operator_delete((void *)local_90._0_8_,CONCAT71(local_80._1_7_,local_80[0]) + 1);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
    if (TVar1 != TRUE) goto switchD_0010f76b_caseD_27;
    advance(in_RSI);
    pCVar7 = (CompileContext *)operator_new(0x10);
    (pCVar7->m_source)._M_dataplus._M_p = (pointer)&PTR__Expr_001273c0;
    *(undefined1 *)&(pCVar7->m_source)._M_string_length = 1;
LAB_0010fa99:
    this->m_context = pCVar7;
    return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
           (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
  }
  std::__throw_invalid_argument("stod");
LAB_0010fdf0:
  uVar11 = std::__throw_out_of_range("stoi");
  std::
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  ::~vector(&local_68);
  if ((_Head_base<0UL,_enact::Expr_*,_false>)local_a0._0_8_ !=
      (_Head_base<0UL,_enact::Expr_*,_false>)0x0) {
    (**(code **)((((string *)local_a0._0_8_)->_M_dataplus)._M_p + 8))();
  }
  if ((void *)local_90._0_8_ != pvVar12) {
    operator_delete((void *)local_90._0_8_,CONCAT71(local_80._1_7_,local_80[0]) + 1);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecPrimary() {
        if (consume(TokenType::INTEGER)) {
            return std::make_unique<IntegerExpr>(std::stoi(m_previous.lexeme));
        }
        if (consume(TokenType::FLOAT)) {
            return std::make_unique<FloatExpr>(std::stod(m_previous.lexeme));
        }

        if (consume(TokenType::TRUE))  {
            return std::make_unique<BooleanExpr>(true);
        }
        if (consume(TokenType::FALSE)) {
            return std::make_unique<BooleanExpr>(false);
        }

        if (consume(TokenType::STRING)) {
            return std::make_unique<StringExpr>(m_previous.lexeme);
        }

        if (consume(TokenType::INTERPOLATION)) {
            return parseInterpolationExpr();
        }

        if (consume(TokenType::IDENTIFIER)) {
            return std::make_unique<SymbolExpr>(m_previous);
        }

        if (consume(TokenType::LEFT_PAREN)) {
            Token paren = m_previous;

            // Unit type ()
            if (consume(TokenType::RIGHT_PAREN)) return std::make_unique<UnitExpr>(std::move(paren));

            // Grouping (expr)
            std::unique_ptr<Expr> expr = parseExpr();
            if (consume(TokenType::RIGHT_PAREN)) return expr;

            // Tuple (expr, expr...)
            std::vector<std::unique_ptr<Expr>> elems{};
            elems.push_back(std::move(expr));
            while (consume(TokenType::COMMA)) {
                elems.push_back(parseExpr());
            }

            expect(TokenType::RIGHT_PAREN, "Expected ')' after tuple elements.");

            return std::make_unique<TupleExpr>(std::move(elems), std::move(paren));
        }

        throw errorAtCurrent("Expected expression.");
    }